

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitApplyCall(ParseNodeCall *pnodeCall,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                  BOOL fReturnValue)

{
  ByteCodeWriter *this;
  ParseNode *this_00;
  ParseNodePtr pPVar1;
  ParseNode *pnode;
  Symbol *this_01;
  code *pcVar2;
  bool bVar3;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  ByteCodeLabel labelID_01;
  PropertyId propertyId;
  RegSlot RVar4;
  RegSlot R0;
  ParseNodeBin *pPVar5;
  undefined4 *puVar6;
  ParseNodeName *this_02;
  
  this_00 = pnodeCall->pnodeTarget;
  pPVar5 = ParseNode::AsParseNodeBin(pnodeCall->pnodeArgs);
  pPVar1 = pPVar5->pnode1;
  if (this_00->nop != knopDot) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1eec,"(applyNode->nop == knopDot)","applyNode->nop == knopDot");
    if (!bVar3) goto LAB_0081d9b0;
    *puVar6 = 0;
  }
  pPVar5 = ParseNode::AsParseNodeBin(this_00);
  pnode = pPVar5->pnode1;
  this = &byteCodeGenerator->m_writer;
  labelID = Js::ByteCodeWriter::DefineLabel(this);
  labelID_00 = Js::ByteCodeWriter::DefineLabel(this);
  labelID_01 = Js::ByteCodeWriter::DefineLabel(this);
  if (this_00->nop != knopDot) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1ef3,"(applyNode->nop == knopDot)","applyNode->nop == knopDot");
    if (!bVar3) goto LAB_0081d9b0;
    *puVar6 = 0;
  }
  Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
  FuncInfo::AcquireLoc(funcInfo,this_00);
  pPVar5 = ParseNode::AsParseNodeBin(this_00);
  this_02 = ParseNode::AsParseNodeName(pPVar5->pnode2);
  propertyId = ParseNodeName::PropertyIdFromNameNode(this_02);
  EmitMethodFld(this_00,pnode->location,propertyId,byteCodeGenerator,funcInfo,false);
  this_01 = funcInfo->argumentsSymbol;
  if (this_01 != (Symbol *)0x0) {
    bVar3 = Symbol::IsArguments(this_01);
    if (bVar3) goto LAB_0081d83d;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                     ,0x1f02,"(argSym && argSym->IsArguments())","argSym && argSym->IsArguments()");
  if (!bVar3) {
LAB_0081d9b0:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar6 = 0;
LAB_0081d83d:
  RVar4 = this_01->location;
  Js::ByteCodeWriter::Reg1(this,LdArgumentsFromFrame,RVar4);
  Js::ByteCodeWriter::BrReg1(this,BrNotNull_A,labelID_01,RVar4);
  Js::ByteCodeWriter::BrReg1(this,BrFncNeqApply,labelID,this_00->location);
  RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
  Js::ByteCodeWriter::Reg1(this,LdStackArgPtr,RVar4);
  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
  Js::ByteCodeWriter::Reg1(this,LdArgCnt,R0);
  Js::ByteCodeWriter::Reg5(this,ApplyArgs,pnode->location,pnode->location,pPVar1->location,RVar4,R0)
  ;
  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  FuncInfo::ReleaseTmpRegister(funcInfo,RVar4);
  FuncInfo::ReleaseLoc(funcInfo,this_00);
  FuncInfo::ReleaseLoc(funcInfo,pnode);
  VisitClearTmpRegs(this_00,byteCodeGenerator,funcInfo);
  VisitClearTmpRegs(pnode,byteCodeGenerator,funcInfo);
  Js::ByteCodeWriter::Br(this,labelID_00);
  Js::ByteCodeWriter::MarkLabel(this,labelID);
  if (funcInfo->frameObjRegister != 0xffffffff) {
    ByteCodeGenerator::EmitScopeObjectInit(byteCodeGenerator,funcInfo);
  }
  ByteCodeGenerator::LoadHeapArguments(byteCodeGenerator,funcInfo);
  Js::ByteCodeWriter::MarkLabel(this,labelID_01);
  EmitCall(pnodeCall,byteCodeGenerator,funcInfo,fReturnValue,1,0xffffffff,0xffffffff);
  Js::ByteCodeWriter::MarkLabel(this,labelID_00);
  return;
}

Assistant:

void EmitApplyCall(ParseNodeCall* pnodeCall, ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo, BOOL fReturnValue)
{
    ParseNode* applyNode = pnodeCall->pnodeTarget;
    ParseNode* thisNode = pnodeCall->pnodeArgs->AsParseNodeBin()->pnode1;
    Assert(applyNode->nop == knopDot);

    ParseNode* funcNode = applyNode->AsParseNodeBin()->pnode1;
    Js::ByteCodeLabel slowPath = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel afterSlowPath = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel argsAlreadyCreated = byteCodeGenerator->Writer()->DefineLabel();

    Assert(applyNode->nop == knopDot);

    Emit(funcNode, byteCodeGenerator, funcInfo, false);

    funcInfo->AcquireLoc(applyNode);
    Js::PropertyId propertyId = applyNode->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode();

    // As we won't be emitting a call instruction for apply, no need to register the cacheId for apply
    // load to be associated with the call. This is also required, as in the absence of a corresponding
    // call for apply, we won't remove the entry for "apply" cacheId from
    // ByteCodeWriter::callRegToLdFldCacheIndexMap, which is contrary to our assumption that we would
    // have removed an entry from a map upon seeing its corresponding call.
    EmitMethodFld(applyNode, funcNode->location, propertyId, byteCodeGenerator, funcInfo, false /*registerCacheIdForCall*/);

    Symbol *argSym = funcInfo->GetArgumentsSymbol();
    Assert(argSym && argSym->IsArguments());
    Js::RegSlot argumentsLoc = argSym->GetLocation();

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdArgumentsFromFrame, argumentsLoc);
    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrNotNull_A, argsAlreadyCreated, argumentsLoc);

    // If apply is overridden, bail to slow path.
    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFncNeqApply, slowPath, applyNode->location);

    // Note: acquire and release a temp register for this stack arg pointer instead of trying to stash it
    // in funcInfo->stackArgReg. Otherwise, we'll needlessly load and store it in jitted loop bodies and
    // may crash if we try to unbox it on the store.
    Js::RegSlot stackArgReg = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdStackArgPtr, stackArgReg);

    Js::RegSlot argCountLocation = funcInfo->AcquireTmpRegister();

    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdArgCnt, argCountLocation);
    byteCodeGenerator->Writer()->Reg5(Js::OpCode::ApplyArgs, funcNode->location, funcNode->location, thisNode->location, stackArgReg, argCountLocation);

    funcInfo->ReleaseTmpRegister(argCountLocation);
    funcInfo->ReleaseTmpRegister(stackArgReg);
    funcInfo->ReleaseLoc(applyNode);
    funcInfo->ReleaseLoc(funcNode);

    // Clear these nodes as they are going to be used to re-generate the slow path.
    VisitClearTmpRegs(applyNode, byteCodeGenerator, funcInfo);
    VisitClearTmpRegs(funcNode, byteCodeGenerator, funcInfo);

    byteCodeGenerator->Writer()->Br(afterSlowPath);

    // slow path
    byteCodeGenerator->Writer()->MarkLabel(slowPath);
    if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
    {
        byteCodeGenerator->EmitScopeObjectInit(funcInfo);
    }
    byteCodeGenerator->LoadHeapArguments(funcInfo);

    byteCodeGenerator->Writer()->MarkLabel(argsAlreadyCreated);
    EmitCall(pnodeCall, byteCodeGenerator, funcInfo, fReturnValue, /*fEvaluateComponents*/true);
    byteCodeGenerator->Writer()->MarkLabel(afterSlowPath);
}